

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> * __thiscall
soul::ResolutionPass::FunctionResolver::findAllPossibleFunctions
          (ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
           *__return_storage_ptr__,FunctionResolver *this,CallOrCast *call,QualifiedIdentifier *name
          )

{
  ResolutionPass *pRVar1;
  void *pvVar2;
  bool bVar3;
  size_t sVar4;
  Scope *pSVar5;
  Identifier i_00;
  Type *pTVar6;
  Structure *pSVar7;
  CommaSeparatedList *pCVar8;
  Expression *pEVar9;
  pool_ref<soul::AST::ASTObject> *ppVar10;
  Function *pFVar11;
  ArrayView<soul::pool_ptr<soul::AST::Constant>_> local_410;
  ArrayView<soul::Type> local_400;
  PossibleFunction local_3f0;
  pool_ref<soul::AST::ASTObject> local_3e0;
  pool_ptr<soul::AST::Function> local_3d8;
  pool_ptr<soul::AST::Function> f;
  pool_ref<soul::AST::ASTObject> *i;
  pool_ref<soul::AST::ASTObject> *__end2;
  pool_ref<soul::AST::ASTObject> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *__range2;
  pool_ptr<soul::AST::Constant> local_3a8;
  pool_ref<soul::AST::Expression> *local_3a0;
  pool_ref<soul::AST::Expression> *c;
  pool_ref<soul::AST::Expression> *__end3;
  pool_ref<soul::AST::Expression> *__begin3;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *__range3;
  ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> constantArgs;
  StructDeclaration *structDecl;
  void *ownerASTObject;
  IdentifierPath local_2d8;
  IdentifierPath local_280;
  IdentifierPath local_228;
  undefined1 local_1c0 [8];
  NameSearch search;
  TypeArray argTypes;
  QualifiedIdentifier *name_local;
  CallOrCast *call_local;
  FunctionResolver *this_local;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> *results;
  
  AST::CallOrCastBase::getArgumentTypes
            ((TypeArray *)&search.findVariables,&call->super_CallOrCastBase);
  AST::Scope::NameSearch::NameSearch((NameSearch *)local_1c0);
  AST::QualifiedIdentifier::getPath(&local_228,name);
  IdentifierPath::operator=((IdentifierPath *)(search.itemsFound.space + 7),&local_228);
  IdentifierPath::~IdentifierPath(&local_228);
  search.partiallyQualifiedPath.pathSections.space[7]._0_1_ = 0;
  sVar4 = ArrayWithPreallocation<soul::Type,_8UL>::size
                    ((ArrayWithPreallocation<soul::Type,_8UL> *)&search.findVariables);
  search.partiallyQualifiedPath.pathSections.space[7]._4_4_ = (undefined4)sVar4;
  search.stopAtFirstScopeWithResults = false;
  search._177_1_ = 0;
  search._178_1_ = 1;
  search._179_1_ = 0;
  search.requiredNumFunctionArgs._0_1_ = 0;
  search.requiredNumFunctionArgs._1_1_ = 0;
  search.requiredNumFunctionArgs._2_1_ = 0;
  pSVar5 = AST::ASTObject::getParentScope((ASTObject *)call);
  AST::Scope::performFullNameSearch(pSVar5,(NameSearch *)local_1c0,(Statement *)0x0);
  AST::QualifiedIdentifier::getPath(&local_280,name);
  bVar3 = IdentifierPath::isUnqualified(&local_280);
  IdentifierPath::~IdentifierPath(&local_280);
  if (bVar3) {
    pRVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).owner;
    i_00 = IdentifierPath::getLastPart((IdentifierPath *)(search.itemsFound.space + 7));
    IdentifierPath::withSuffix(&local_2d8,&pRVar1->intrinsicsNamespacePath,i_00);
    IdentifierPath::operator=((IdentifierPath *)(search.itemsFound.space + 7),&local_2d8);
    IdentifierPath::~IdentifierPath(&local_2d8);
    pSVar5 = AST::ASTObject::getParentScope((ASTObject *)call);
    AST::Scope::performFullNameSearch(pSVar5,(NameSearch *)local_1c0,(Statement *)0x0);
    if (((call->super_CallOrCastBase).isMethodCall & 1U) != 0) {
      sVar4 = ArrayWithPreallocation<soul::Type,_8UL>::size
                        ((ArrayWithPreallocation<soul::Type,_8UL> *)&search.findVariables);
      checkAssertion(sVar4 != 0,"argTypes.size() != 0","findAllPossibleFunctions",0x99f);
      pTVar6 = ArrayWithPreallocation<soul::Type,_8UL>::front
                         ((ArrayWithPreallocation<soul::Type,_8UL> *)&search.findVariables);
      bVar3 = Type::isStruct(pTVar6);
      if (bVar3) {
        pTVar6 = ArrayWithPreallocation<soul::Type,_8UL>::front
                           ((ArrayWithPreallocation<soul::Type,_8UL> *)&search.findVariables);
        pSVar7 = Type::getStructRef(pTVar6);
        pvVar2 = pSVar7->backlinkToASTObject;
        if (pvVar2 != (void *)0x0) {
          AST::QualifiedIdentifier::getPath((IdentifierPath *)(constantArgs.space + 3),name);
          IdentifierPath::operator=
                    ((IdentifierPath *)(search.itemsFound.space + 7),
                     (IdentifierPath *)(constantArgs.space + 3));
          IdentifierPath::~IdentifierPath((IdentifierPath *)(constantArgs.space + 3));
          AST::Scope::performFullNameSearch
                    (*(Scope **)((long)pvVar2 + 0x20),(NameSearch *)local_1c0,(Statement *)0x0);
        }
      }
    }
  }
  ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&__range3);
  bVar3 = pool_ptr<soul::AST::CommaSeparatedList>::operator!=
                    (&(call->super_CallOrCastBase).arguments,(void *)0x0);
  if (bVar3) {
    sVar4 = ArrayWithPreallocation<soul::Type,_8UL>::size
                      ((ArrayWithPreallocation<soul::Type,_8UL> *)&search.findVariables);
    ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::reserve
              ((ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&__range3,sVar4);
    pCVar8 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                       (&(call->super_CallOrCastBase).arguments);
    __begin3 = (pool_ref<soul::AST::Expression> *)&pCVar8->items;
    __end3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin
                       ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                        __begin3);
    c = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::end
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)__begin3);
    for (; __end3 != c; __end3 = __end3 + 1) {
      local_3a0 = __end3;
      pEVar9 = pool_ref<soul::AST::Expression>::operator->(__end3);
      (*(pEVar9->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_3a8);
      ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::push_back
                ((ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&__range3,
                 &local_3a8);
      pool_ptr<soul::AST::Constant>::~pool_ptr(&local_3a8);
    }
  }
  else {
    sVar4 = ArrayWithPreallocation<soul::Type,_8UL>::size
                      ((ArrayWithPreallocation<soul::Type,_8UL> *)&search.findVariables);
    ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::resize
              ((ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&__range3,sVar4);
  }
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::
  ArrayWithPreallocation(__return_storage_ptr__);
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)local_1c0
                     );
  ppVar10 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::end
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                       local_1c0);
  for (; __end2 != ppVar10; __end2 = __end2 + 1) {
    f.object = (Function *)__end2;
    local_3e0 = (pool_ref<soul::AST::ASTObject>)__end2->object;
    cast<soul::AST::Function,soul::AST::ASTObject>((soul *)&local_3d8,&local_3e0);
    pool_ref<soul::AST::ASTObject>::~pool_ref(&local_3e0);
    bVar3 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_3d8);
    if (bVar3) {
      pFVar11 = pool_ptr<soul::AST::Function>::operator->(&local_3d8);
      bVar3 = pool_ptr<soul::AST::Function>::operator==
                        (&pFVar11->originalGenericFunction,(void *)0x0);
      if (bVar3) {
        pFVar11 = pool_ptr<soul::AST::Function>::operator*(&local_3d8);
        ArrayView<soul::Type>::ArrayView<soul::ArrayWithPreallocation<soul::Type,8ul>>
                  (&local_400,(ArrayWithPreallocation<soul::Type,_8UL> *)&search.findVariables);
        ArrayView<soul::pool_ptr<soul::AST::Constant>>::
        ArrayView<soul::ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,4ul>>
                  ((ArrayView<soul::pool_ptr<soul::AST::Constant>> *)&local_410,
                   (ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&__range3);
        PossibleFunction::PossibleFunction(&local_3f0,pFVar11,local_400,local_410);
        ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::
        push_back(__return_storage_ptr__,&local_3f0);
      }
    }
    pool_ptr<soul::AST::Function>::~pool_ptr(&local_3d8);
  }
  ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *)&__range3);
  AST::Scope::NameSearch::~NameSearch((NameSearch *)local_1c0);
  ArrayWithPreallocation<soul::Type,_8UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Type,_8UL> *)&search.findVariables);
  return __return_storage_ptr__;
}

Assistant:

ArrayWithPreallocation<PossibleFunction, 4> findAllPossibleFunctions (const AST::CallOrCast& call,
                                                                              const AST::QualifiedIdentifier& name)
        {
            auto argTypes = call.getArgumentTypes();

            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = name.getPath();
            search.stopAtFirstScopeWithResults = false;
            search.requiredNumFunctionArgs = (int) argTypes.size();
            search.findVariables = false;
            search.findTypes = false;
            search.findFunctions = true;
            search.findNamespaces = false;
            search.findProcessors = false;
            search.findProcessorInstances = false;
            search.findEndpoints = false;

            call.getParentScope()->performFullNameSearch (search, nullptr);

            if (name.getPath().isUnqualified())
            {
                // Handle intrinsics with no explicit namespace
                search.partiallyQualifiedPath = owner.intrinsicsNamespacePath.withSuffix (search.partiallyQualifiedPath.getLastPart());
                call.getParentScope()->performFullNameSearch (search, nullptr);

                // Handle "Koenig" lookup for method calls
                if (call.isMethodCall)
                {
                    SOUL_ASSERT (argTypes.size() != 0);

                    if (argTypes.front().isStruct())
                    {
                        if (auto ownerASTObject = argTypes.front().getStructRef().backlinkToASTObject)
                        {
                            auto structDecl = reinterpret_cast<AST::StructDeclaration*> (ownerASTObject);

                            search.partiallyQualifiedPath = name.getPath();
                            structDecl->context.parentScope->performFullNameSearch (search, nullptr);
                        }
                    }
                }
            }

            ArrayWithPreallocation<pool_ptr<AST::Constant>, 4> constantArgs;

            if (call.arguments != nullptr)
            {
                constantArgs.reserve (argTypes.size());

                for (auto& c : call.arguments->items)
                    constantArgs.push_back (c->getAsConstant());
            }
            else
            {
                constantArgs.resize (argTypes.size());
            }

            ArrayWithPreallocation<PossibleFunction, 4> results;

            for (auto& i : search.itemsFound)
                if (auto f = cast<AST::Function> (i))
                    if (f->originalGenericFunction == nullptr)
                        results.push_back (PossibleFunction (*f, argTypes, constantArgs));

            return results;
        }